

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttload.c
# Opt level: O3

FT_Error tt_face_load_any(TT_Face face,FT_ULong tag,FT_Long offset,FT_Byte *buffer,FT_ULong *length)

{
  FT_Error FVar1;
  FT_ULong count;
  TT_Table pTVar2;
  FT_ULong FVar3;
  TT_Table pTVar4;
  
  if (tag == 0) {
    FVar3 = ((face->root).stream)->size;
LAB_00243634:
    count = FVar3;
    if ((length != (FT_ULong *)0x0) && (count = *length, *length == 0)) {
      *length = FVar3;
      return 0;
    }
    FVar1 = FT_Stream_ReadAt((face->root).stream,offset,buffer,count);
    return FVar1;
  }
  if (face->num_tables != 0) {
    pTVar4 = face->dir_tables;
    pTVar2 = pTVar4 + face->num_tables;
    do {
      if ((pTVar4->Tag == tag) && (FVar3 = pTVar4->Length, FVar3 != 0)) {
        offset = offset + pTVar4->Offset;
        goto LAB_00243634;
      }
      pTVar4 = pTVar4 + 1;
    } while (pTVar4 < pTVar2);
  }
  return 0x8e;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_face_load_any( TT_Face    face,
                    FT_ULong   tag,
                    FT_Long    offset,
                    FT_Byte*   buffer,
                    FT_ULong*  length )
  {
    FT_Error   error;
    FT_Stream  stream;
    TT_Table   table;
    FT_ULong   size;


    if ( tag != 0 )
    {
      /* look for tag in font directory */
      table = tt_face_lookup_table( face, tag );
      if ( !table )
      {
        error = FT_THROW( Table_Missing );
        goto Exit;
      }

      offset += table->Offset;
      size    = table->Length;
    }
    else
      /* tag == 0 -- the user wants to access the font file directly */
      size = face->root.stream->size;

    if ( length && *length == 0 )
    {
      *length = size;

      return FT_Err_Ok;
    }

    if ( length )
      size = *length;

    stream = face->root.stream;
    /* the `if' is syntactic sugar for picky compilers */
    if ( FT_STREAM_READ_AT( offset, buffer, size ) )
      goto Exit;

  Exit:
    return error;
  }